

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_clone_alloc(wally_tx *tx,uint32_t flags,wally_tx **output)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  long lVar4;
  undefined1 free_parent;
  ulong uVar5;
  ulong uVar6;
  wally_tx *result;
  wally_tx *local_30;
  
  local_30 = (wally_tx *)0x0;
  if (output == (wally_tx **)0x0) {
    return -2;
  }
  *output = (wally_tx *)0x0;
  _Var2 = is_valid_tx(tx);
  if (flags != 0 || !_Var2) {
    return -2;
  }
  uVar5 = (ulong)tx->locktime;
  iVar3 = wally_tx_init_alloc(tx->version,tx->locktime,tx->num_inputs,tx->num_outputs,&local_30);
  free_parent = (undefined1)uVar5;
  if (iVar3 == 0) {
    uVar6 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      free_parent = (undefined1)uVar5;
      uVar6 = uVar6 + 1;
      if (tx->num_inputs <= uVar6) {
        uVar6 = 0xffffffffffffffff;
        lVar4 = 0;
        goto LAB_001087f7;
      }
      if (local_30 == (wally_tx *)0x0) goto LAB_00108826;
      uVar1 = (uint)local_30->num_inputs;
      uVar5 = (ulong)uVar1;
      iVar3 = wally_tx_add_input_at(local_30,uVar1,(wally_tx_input *)(tx->inputs->txhash + lVar4));
      free_parent = (undefined1)uVar5;
      lVar4 = lVar4 + 0xd0;
    } while (iVar3 == 0);
  }
  goto LAB_0010879d;
LAB_00108826:
  iVar3 = -2;
  goto LAB_0010879d;
  while( true ) {
    uVar1 = (uint)local_30->num_outputs;
    uVar5 = (ulong)uVar1;
    iVar3 = wally_tx_add_output_at
                      (local_30,uVar1,(wally_tx_output *)((long)&tx->outputs->satoshi + lVar4));
    free_parent = (undefined1)uVar5;
    lVar4 = lVar4 + 0x70;
    if (iVar3 != 0) break;
LAB_001087f7:
    free_parent = (undefined1)uVar5;
    uVar6 = uVar6 + 1;
    if (tx->num_outputs <= uVar6) {
      *output = local_30;
      return 0;
    }
    if (local_30 == (wally_tx *)0x0) goto LAB_00108826;
  }
LAB_0010879d:
  tx_free(local_30,(_Bool)free_parent);
  return iVar3;
}

Assistant:

int wally_tx_clone_alloc(const struct wally_tx *tx, uint32_t flags, struct wally_tx **output)
{
    size_t i;
    struct wally_tx *result = NULL;
    int ret;

    TX_CHECK_OUTPUT;

    if (!is_valid_tx(tx) || flags != 0)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(tx->version, tx->locktime, tx->num_inputs, tx->num_outputs, &result);

    for (i = 0; ret == WALLY_OK && i < tx->num_inputs; ++i)
        ret = wally_tx_add_input(result, &tx->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < tx->num_outputs; ++i)
        ret = wally_tx_add_output(result, &tx->outputs[i]);

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);

    return ret;
}